

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

void __thiscall
UnitBoundedPolynomial<3U,_2U>::walk
          (UnitBoundedPolynomial<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_double_UnitBoundedPolynomial<3U,_2U>_ptr_void_ptr *fn,void *payload,
          double a,double b)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  UnitBoundedPolynomial<3U,_2U> *pUVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double tau;
  double dVar8;
  double dVar9;
  double dVar10;
  VectorNd VVar11;
  VectorNd p;
  undefined1 local_38 [16];
  
  if (a <= b) {
    do {
      uVar6 = -(ulong)(b - a < deltatau);
      dVar10 = (double)(~uVar6 & (ulong)a | uVar6 & (ulong)b);
      lVar3 = 0;
      pUVar4 = (UnitBoundedPolynomial<3U,_2U> *)local_38;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        dVar7 = 0.0;
        lVar5 = 0;
        dVar8 = 1.0;
        do {
          dVar9 = dVar10 * dVar8;
          dVar7 = dVar7 + dVar8 * this->_dims[lVar3].coeffs[lVar5];
          lVar5 = lVar5 + 1;
          dVar8 = dVar9;
        } while (lVar5 != 4);
        pUVar4->_dims[0].coeffs[0] = dVar7;
        lVar3 = 1;
        pUVar4 = (UnitBoundedPolynomial<3U,_2U> *)(local_38 + 8);
        bVar1 = false;
      } while (bVar2);
      VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = dVar9;
      VVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = dVar10;
      (*fn)(VVar11,dVar9,(UnitBoundedPolynomial<3U,_2U> *)local_38,this);
      a = dVar10 + deltatau;
    } while (a <= b);
  }
  return;
}

Assistant:

void UnitBoundedPolynomial<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, double, const UnitBoundedPolynomial<Order, Dims>&, void *), void *payload, double a, double b) const
{
    double tau = a;
    while (tau <= b)
    {
        if (b - tau < deltatau)
        {
            tau = b;
        }

        fn(interpolate(tau), tau, *this, payload);

        tau += deltatau;
    }
}